

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * getOrCreateMenu(QWidget *menu,QAction *action)

{
  QWidget *owner;
  QWidget *action_00;
  QAccessibleMenuItem *in_RSI;
  QAccessibleInterface *iface;
  
  owner = (QWidget *)QAccessible::queryAccessibleInterface((QObject *)in_RSI);
  action_00 = owner;
  if (owner == (QWidget *)0x0) {
    action_00 = (QWidget *)operator_new(0x28);
    QAccessibleMenuItem::QAccessibleMenuItem(in_RSI,owner,(QAction *)action_00);
    QAccessible::registerAccessibleInterface((QAccessibleInterface *)action_00);
  }
  return (QAccessibleInterface *)action_00;
}

Assistant:

QAccessibleInterface *getOrCreateMenu(QWidget *menu, QAction *action)
{
    QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(action);
    if (!iface) {
        iface = new QAccessibleMenuItem(menu, action);
        QAccessible::registerAccessibleInterface(iface);
    }
    return iface;
}